

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O1

Node __thiscall trieste::Parse::parse_file(Parse *this,path *filename)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar1;
  path *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  undefined1 auVar3 [16];
  Node NVar4;
  Source source;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  path local_48;
  
  if (filename[1]._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl !=
      (_Impl *)0x0) {
    cVar1 = (*(code *)filename[2]._M_pathname._M_dataplus._M_p)
                      (&filename[1]._M_pathname.field_2,filename);
    if (cVar1 == '\0') {
      *(undefined8 *)this = 0;
      this->wf_ = (Wellformed *)0x0;
      _Var2._M_pi = extraout_RDX;
      goto LAB_0018a237;
    }
  }
  SourceDef::load((SourceDef *)local_98,in_RDX);
  auVar3 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar3._8_8_ == 0 ||
      auVar3._0_8_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    CLI::std::filesystem::__cxx11::path::path(&local_48);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_68,auVar3._0_8_,0,auVar3._8_8_);
    CLI::std::filesystem::__cxx11::path::path(&local_48,&local_68,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  local_88._M_allocated_capacity = (size_type)(local_98 + 0x20);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_98 + 0x10),local_48._M_pathname._M_dataplus._M_p,
             local_48._M_pathname._M_dataplus._M_p + local_48._M_pathname._M_string_length);
  local_68._M_dataplus._M_p = File;
  parse_source(this,&filename->_M_pathname,(Token *)(local_98 + 0x10),(Source *)&local_68);
  if ((undefined1 *)local_88._M_allocated_capacity != local_98 + 0x20) {
    operator_delete((void *)local_88._M_allocated_capacity,(size_t)(local_78._M_p + 1));
  }
  CLI::std::filesystem::__cxx11::path::~path(&local_48);
  _Var2._M_pi = extraout_RDX_00;
  if ((filename[3]._M_pathname.field_2._M_allocated_capacity != 0) && (*(long *)this != 0)) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->wf_;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (filename[3]._M_pathname.field_2._M_allocated_capacity == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)&filename[3]._M_pathname.field_2 + 8))(filename + 3,filename);
    _Var2._M_pi = extraout_RDX_01;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var2._M_pi = extraout_RDX_02;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    _Var2._M_pi = extraout_RDX_03;
  }
LAB_0018a237:
  NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node parse_file(const std::filesystem::path& filename) const
    {
      if (prefile_ && !prefile_(*this, filename))
        return {};

      auto source = SourceDef::load(filename);
      auto ast = parse_source(filename.stem().string(), File, source);

      if (postfile_ && ast)
        postfile_(*this, filename, ast);

      return ast;
    }